

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineBspline.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChLineBspline::Evaluate(ChLineBspline *this,ChVector<double> *pos,double parU)

{
  ChVector<double> *pCVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  double *pdVar6;
  int i;
  double *pdVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  ChVectorDynamic<> N;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  double local_28;
  
  if (this->closed == true) {
    parU = fmod(parU,1.0);
  }
  local_28 = ComputeKnotUfromU(this,parU);
  i = ChBasisToolsBspline::FindSpan(this->p,local_28,&this->knots);
  local_38.m_storage.m_data = (double *)0x0;
  local_38.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_38,(long)this->p + 1);
  ChBasisToolsBspline::BasisEvaluate(this->p,i,local_28,&this->knots,(ChVectorDynamic<> *)&local_38)
  ;
  if (pos != (ChVector<double> *)&VNULL) {
    pos->m_data[0] = VNULL;
    pos->m_data[1] = DAT_00b689a0;
    pos->m_data[2] = DAT_00b689a8;
  }
  uVar5 = this->p;
  if ((int)uVar5 < 0) {
    if (local_38.m_storage.m_data == (double *)0x0) {
      return;
    }
  }
  else {
    dVar9 = pos->m_data[0];
    dVar10 = pos->m_data[1];
    dVar2 = pos->m_data[2];
    pdVar7 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(int)(i - uVar5)].m_data + 2;
    uVar8 = 0;
    do {
      if ((~(local_38.m_storage.m_rows >> 0x3f) & local_38.m_storage.m_rows) == uVar8) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      dVar3 = local_38.m_storage.m_data[uVar8];
      uVar8 = uVar8 + 1;
      dVar4 = *pdVar7;
      pCVar1 = (ChVector<double> *)(pdVar7 + -2);
      pdVar6 = pdVar7 + -1;
      pdVar7 = pdVar7 + 3;
      dVar9 = dVar3 * pCVar1->m_data[0] + dVar9;
      dVar10 = dVar3 * *pdVar6 + dVar10;
      dVar2 = dVar3 * dVar4 + dVar2;
      pos->m_data[0] = dVar9;
      pos->m_data[1] = dVar10;
      pos->m_data[2] = dVar2;
    } while ((ulong)uVar5 + 1 != uVar8);
  }
  free((void *)local_38.m_storage.m_data[-1]);
  return;
}

Assistant:

void ChLineBspline::Evaluate(ChVector<>& pos, const double parU) const {
	double mU;
	if (this->closed)
		mU = fmod(parU, 1.0);
	else
		mU = parU;

    double u = ComputeKnotUfromU(mU);

    int spanU = ChBasisToolsBspline::FindSpan(this->p, u, this->knots);

    ChVectorDynamic<> N(this->p + 1);
    ChBasisToolsBspline::BasisEvaluate(this->p, spanU, u, this->knots, N);

    pos = VNULL;
    int uind = spanU - p;
    for (int i = 0; i <= this->p; i++) {
        pos += points[uind + i] * N(i);
    }
}